

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O2

bool __thiscall
wasm::CodeFolding::optimizeTerminatingTails
          (CodeFolding *this,
          vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *tails,Index num
          )

{
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  __last;
  pointer ppEVar1;
  Expression *curr;
  uintptr_t uVar2;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_CodeFolding_cpp:657:42)>
  __pred;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_CodeFolding_cpp:585:31)>
  __pred_00;
  pointer pTVar3;
  bool bVar4;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  _Var5;
  pointer *pppEVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  __first;
  pointer ppEVar9;
  Break *pBVar10;
  Block *pBVar11;
  Block *pBVar12;
  Block *pBVar13;
  pointer ppEVar14;
  long lVar15;
  iterator __begin3;
  undefined1 auVar16 [8];
  ulong uVar17;
  iterator __end3;
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar18;
  string_view name;
  Signature SVar19;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_CodeFolding_cpp:638:28)>
  __pred_01;
  undefined1 auStack_280 [8];
  LabelManager labels;
  undefined1 local_150 [8];
  anon_class_16_2_c54e8edd worthIt;
  anon_class_8_1_7edb1669 getTailItems;
  Expression *item_1;
  value_type first;
  Expression *correct;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> explore;
  undefined1 local_100 [8];
  Builder builder;
  undefined1 local_d0 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> mergeable;
  pointer *pppEStack_a0;
  mapped_type hash;
  Expression **local_90;
  undefined1 local_88 [8];
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> next;
  mapped_type digest;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> others;
  anon_class_8_1_b991b068 getItem;
  undefined1 local_35 [8];
  anon_class_1_0_00000001 effectiveSize;
  Index num_local;
  
  _Var5._M_current =
       (tails->super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (tails->super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)(((long)__last._M_current - (long)_Var5._M_current) / 0x18) < 2) {
    return false;
  }
  local_35._1_4_ = num;
  _Var5 = std::
          __remove_if<__gnu_cxx::__normal_iterator<wasm::CodeFolding::Tail*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>,__gnu_cxx::__ops::_Iter_pred<wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::CodeFolding::Tail&)_1_>>
                    (_Var5,__last,
                     (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_CodeFolding_cpp:509:22)>
                      )this);
  std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::erase
            (tails,(const_iterator)_Var5._M_current,
             (tails->
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  pppEVar6 = &others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_150 = (undefined1  [8])&worthIt.this;
  worthIt.getTailItems = (anon_class_8_1_7edb1669 *)this;
  worthIt.this = (CodeFolding *)pppEVar6;
  explore.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tails;
  others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_35;
  std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::vector
            ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)local_88,
             tails);
  labels.
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .replacep = (Expression **)(local_35 + 1);
  __pred_00._M_pred.num =
       (Index *)labels.
                super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                .
                super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                .replacep;
  __pred_00._M_pred.effectiveSize = (anon_class_1_0_00000001 *)local_35;
  __pred_00._M_pred.getItem = (anon_class_8_1_b991b068 *)pppEVar6;
  __pred_00._M_pred.this = this;
  auStack_280 = (undefined1  [8])local_35;
  labels.
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .stack.usedFixed = (size_t)pppEVar6;
  labels.
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .stack.fixed._M_elems[0].func = (TaskFunc)this;
  _Var5 = std::
          __remove_if<__gnu_cxx::__normal_iterator<wasm::CodeFolding::Tail*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>,__gnu_cxx::__ops::_Iter_pred<wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::CodeFolding::Tail&)_3_>>
                    ((__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                      )local_88,
                     (__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                      )next.
                       super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                       ._M_impl.super__Vector_impl_data._M_start,__pred_00);
  std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::erase
            ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)local_88,
             (const_iterator)_Var5._M_current,
             (const_iterator)
             next.
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
             _M_impl.super__Vector_impl_data._M_start);
  pTVar3 = next.
           super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)next.
                         super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)local_88) / 0x18)) {
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .stack.fixed._M_elems[0].func = (TaskFunc)&labels;
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .replacep = (Expression **)
                ((ulong)labels.
                        super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                        .
                        super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                        .replacep & 0xffffffff00000000);
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .stack.usedFixed = 0;
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .stack.fixed._M_elems[1].func = (TaskFunc)0x0;
    mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&mergeable;
    mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)mergeable.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .stack.fixed._M_elems[0].currp =
         (Expression **)
         labels.
         super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
         .
         super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
         .stack.fixed._M_elems[0].func;
    for (auVar16 = local_88; auVar16 != (undefined1  [8])pTVar3;
        auVar16 = (undefined1  [8])((long)auVar16 + 0x18)) {
      local_100 = (undefined1  [8])
                  optimizeTerminatingTails::anon_class_8_1_b991b068::operator()
                            ((anon_class_8_1_b991b068 *)
                             &others.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Tail *)auVar16,
                             local_35._1_4_);
      pppEVar6 = (pointer *)ExpressionAnalyzer::hash((Expression *)local_100);
      pmVar7 = std::
               map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
               ::operator[]((map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                             *)auStack_280,(key_type *)local_100);
      *pmVar7 = (mapped_type)pppEVar6;
      pppEStack_a0 = pppEVar6;
      pmVar8 = std::
               map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
               ::operator[]((map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                             *)local_d0,(key_type_conflict *)&pppEStack_a0);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pmVar8,(value_type *)local_100);
    }
    builder.wasm._0_4_ = 0;
    for (auVar16 = local_88;
        auVar16 !=
        (undefined1  [8])
        next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
        _M_impl.super__Vector_impl_data._M_start; auVar16 = (undefined1  [8])((long)auVar16 + 0x18))
    {
      getTailItems.getItem =
           (anon_class_8_1_b991b068 *)
           optimizeTerminatingTails::anon_class_8_1_b991b068::operator()
                     ((anon_class_8_1_b991b068 *)
                      &others.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(Tail *)auVar16,
                      local_35._1_4_);
      pmVar7 = std::
               map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
               ::operator[]((map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                             *)auStack_280,(key_type *)&getTailItems);
      next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*pmVar7;
      pVar18 = std::
               _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
               ::_M_emplace_unique<unsigned_long&>
                         ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                           *)local_100,
                          (unsigned_long *)
                          &next.
                           super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pmVar8 = std::
                 map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                 ::operator[]((map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                               *)local_d0,
                              (key_type_conflict *)
                              &next.
                               super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ppEVar9 = (pmVar8->
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppEVar14 = (pmVar8->
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        lVar15 = (long)ppEVar14 - (long)ppEVar9 >> 3;
        if (lVar15 != 1) {
          if (lVar15 == 0) {
            __assert_fail("items.size() > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodeFolding.cpp"
                          ,0x276,
                          "bool wasm::CodeFolding::optimizeTerminatingTails(std::vector<Tail> &, Index)"
                         );
          }
          while (8 < (ulong)((long)ppEVar14 - (long)ppEVar9)) {
            item_1 = *ppEVar9;
            others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            digest = 0;
            others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            __pred_01._M_pred.others =
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&digest;
            __pred_01._M_pred.first = &item_1;
            __first = std::
                      __remove_if<__gnu_cxx::__normal_iterator<wasm::Expression**,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>,__gnu_cxx::__ops::_Iter_pred<wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::Expression*)_1_>>
                                ((__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                  )(pmVar8->
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start,
                                 (__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                  )(pmVar8->
                                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish,__pred_01);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::erase
                      (pmVar8,(const_iterator)__first._M_current,
                       (const_iterator)
                       (pmVar8->
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
            ppEVar9 = (pmVar8->
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            ppEVar14 = (pmVar8->
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            if (8 < (ulong)((long)ppEVar14 - (long)ppEVar9)) {
              first = *ppEVar9;
              std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::vector
                        ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          *)&correct,
                         (vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          *)local_88);
              pppEStack_a0 = &others.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
              hash = (mapped_type)(local_35 + 1);
              local_90 = &first;
              __pred._M_pred.num = (Index *)hash;
              __pred._M_pred.getItem = (anon_class_8_1_b991b068 *)pppEStack_a0;
              __pred._M_pred.correct = local_90;
              _Var5 = std::
                      __remove_if<__gnu_cxx::__normal_iterator<wasm::CodeFolding::Tail*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>,__gnu_cxx::__ops::_Iter_pred<wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::CodeFolding::Tail&)_4_>>
                                ((__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                                  )correct,
                                 (__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                                  )explore.
                                   super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                   ._M_impl.super__Vector_impl_data._M_start,__pred);
              std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::erase
                        ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          *)&correct,(const_iterator)_Var5._M_current,
                         (const_iterator)
                         explore.
                         super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              bVar4 = optimizeTerminatingTails
                                (this,(vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                       *)&correct,local_35._1_4_ + 1);
              std::_Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
              ~_Vector_base((_Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                             *)&correct);
              if (bVar4) {
                std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               *)&digest);
                std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)local_100);
                std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                             *)local_d0);
                std::
                _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Expression_*const,_unsigned_long>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                ::~_Rb_tree((_Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Expression_*const,_unsigned_long>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                             *)auStack_280);
                goto LAB_00804787;
              }
              ppEVar9 = (pmVar8->
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
              ppEVar14 = (pmVar8->
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
            }
            ppEVar1 = (pmVar8->
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            (pmVar8->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)digest;
            (pmVar8->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish =
                 others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (pmVar8->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            digest = (mapped_type)ppEVar9;
            others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start = ppEVar14;
            others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppEVar1;
            std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
            ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          &digest);
            ppEVar9 = (pmVar8->
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            ppEVar14 = (pmVar8->
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
          }
        }
      }
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)local_100);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                 *)local_d0);
    std::
    _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Expression_*const,_unsigned_long>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Expression_*const,_unsigned_long>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                 *)auStack_280);
  }
  pTVar3 = explore.
           super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((local_35._1_4_ == 0) ||
     (bVar4 = optimizeTerminatingTails::anon_class_16_2_c54e8edd::operator()
                        ((anon_class_16_2_c54e8edd *)local_150,local_35._1_4_,
                         (vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          *)explore.
                            super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4)) {
    bVar4 = false;
    goto LAB_00804789;
  }
  optimizeTerminatingTails::anon_class_8_1_7edb1669::operator()
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_d0,
             (anon_class_8_1_7edb1669 *)&worthIt.this,local_35._1_4_,
             (vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)pTVar3);
  this->anotherPass = true;
  local_100 = (undefined1  [8])
              (this->
              super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
              ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
              super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
              super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.currModule;
  LabelUtils::LabelManager::LabelManager
            ((LabelManager *)auStack_280,
             (this->
             super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
             ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
             super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
             super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.currFunction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&labels.counter,"folding-inner",(allocator<char> *)&pppEStack_a0);
  name = (string_view)
         LabelUtils::LabelManager::getUnique((LabelManager *)auStack_280,(string *)&labels.counter);
  std::__cxx11::string::~string((string *)&labels.counter);
  pBVar11 = pTVar3->block;
  for (pBVar13 = (Block *)pTVar3->expr; pBVar13 != pBVar11;
      pBVar13 = (Block *)&(pBVar13->name).super_IString.str._M_str) {
    curr = (Expression *)
           (pBVar13->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
    if (curr == (Expression *)0x0) {
      markAsModified(this,*(Expression **)
                           &(pBVar13->super_SpecificExpression<(wasm::Expression::Id)1>).
                            super_Expression);
      pBVar10 = Builder::makeBreak((Builder *)local_100,(Name)name,(Expression *)0x0,
                                   (Expression *)0x0);
      *(Break **)(pBVar13->name).super_IString.str._M_len = pBVar10;
    }
    else {
      markAsModified(this,curr);
      uVar17 = 0;
      while( true ) {
        uVar2 = (pBVar13->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
                id;
        if ((ulong)((long)mergeable.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)local_d0 >> 3) <= uVar17
           ) break;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::pop_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   (uVar2 + 0x20));
        uVar17 = (ulong)((int)uVar17 + 1);
      }
      pBVar10 = Builder::makeBreak((Builder *)local_100,(Name)name,(Expression *)0x0,
                                   (Expression *)0x0);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 (uVar2 + 0x20),(Expression *)pBVar10);
      pBVar12 = (Block *)(pBVar13->super_SpecificExpression<(wasm::Expression::Id)1>).
                         super_Expression.type.id;
      Block::finalize(pBVar12,(Type)(pBVar12->super_SpecificExpression<(wasm::Expression::Id)1>).
                                    super_Expression.type.id);
    }
  }
  pBVar13 = (Block *)((this->
                      super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                      ).
                      super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                      .super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
                      super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
                     currFunction)->body;
  pBVar11 = MixedArena::alloc<wasm::Block>((MixedArena *)((long)local_100 + 0x158));
  (pBVar11->name).super_IString.str = name;
  uVar2 = (pBVar13->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  if (uVar2 == 0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar11->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pBVar13);
    pBVar13 = (Block *)MixedArena::alloc<wasm::Return>((MixedArena *)((long)local_100 + 0x158));
    (pBVar13->name).super_IString.str._M_len = 0;
LAB_008046a3:
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar11->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pBVar13);
  }
  else {
    if (uVar2 == 1) goto LAB_008046a3;
    if (((pBVar13->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id !=
         BlockId) ||
       (Block::finalize(pBVar13), pBVar12 = pBVar13,
       (pBVar13->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != 1))
    {
      pBVar12 = (Block *)MixedArena::alloc<wasm::Return>((MixedArena *)((long)local_100 + 0x158));
      (pBVar12->name).super_IString.str._M_len = (size_t)pBVar13;
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar11->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pBVar12);
  }
  Block::finalize(pBVar11);
  pBVar13 = MixedArena::alloc<wasm::Block>((MixedArena *)((long)local_100 + 0x158));
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(pBVar13->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pBVar11);
  for (; local_d0 !=
         (undefined1  [8])
         mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
      mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
           _M_impl.super__Vector_impl_data._M_start + -1) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar13->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
               ._M_impl.super__Vector_impl_data._M_start[-1]);
  }
  SVar19 = HeapType::getSignature
                     (&((this->
                        super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                        ).
                        super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                        .
                        super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                        .super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
                       currFunction)->type);
  Block::finalize(pBVar13,SVar19.results.id);
  ((this->
   super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
   ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
   super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
   super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.currFunction)->body =
       (Expression *)pBVar13;
  LabelUtils::LabelManager::~LabelManager((LabelManager *)auStack_280);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_d0);
LAB_00804787:
  bVar4 = true;
LAB_00804789:
  std::_Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
  ~_Vector_base((_Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                local_88);
  return bVar4;
}

Assistant:

bool optimizeTerminatingTails(std::vector<Tail>& tails, Index num = 0) {
    if (tails.size() < 2) {
      return false;
    }
    // remove things that are untoward and cannot be optimized
    tails.erase(
      std::remove_if(tails.begin(),
                     tails.end(),
                     [&](Tail& tail) {
                       if (tail.expr && modifieds.count(tail.expr) > 0) {
                         return true;
                       }
                       if (tail.block && modifieds.count(tail.block) > 0) {
                         return true;
                       }
                       // if we were not modified, then we should be valid for
                       // processing
                       tail.validate();
                       return false;
                     }),
      tails.end());
    // now let's try to find subsets that are mergeable. we don't look hard
    // for the most optimal; further passes may find more
    // effectiveSize: TODO: special-case fallthrough, matters for returns
    auto effectiveSize = [&](Tail& tail) -> Index {
      if (tail.block) {
        return tail.block->list.size();
      } else {
        return 1;
      }
    };
    // getItem: returns the relevant item from the tail. this includes the
    //          final item
    //          TODO: special-case fallthrough, matters for returns
    auto getItem = [&](Tail& tail, Index num) {
      if (tail.block) {
        return tail.block->list[effectiveSize(tail) - num - 1];
      } else {
        return tail.expr;
      }
    };
    // gets the tail elements of a certain depth
    auto getTailItems = [&](Index num, std::vector<Tail>& tails) {
      std::vector<Expression*> items;
      for (Index i = 0; i < num; i++) {
        auto item = getItem(tails[0], i);
        items.push_back(item);
      }
      return items;
    };
    // estimate if a merging is worth the cost
    auto worthIt = [&](Index num, std::vector<Tail>& tails) {
      auto items = getTailItems(num, tails); // the elements we can merge
      Index saved = 0;                       // how much we can save
      for (auto* item : items) {
        saved += Measurer::measure(item) * (tails.size() - 1);
      }
      // compure the cost: in non-fallthroughs, we are replacing the final
      // element with a br; for a fallthrough, if there is one, we must
      // add a return element (for the function body, so it doesn't reach us)
      // TODO: handle fallthroughts for return
      Index cost = tails.size();
      // we also need to add two blocks: for us to break to, and to contain
      // that block and the merged code. very possibly one of the blocks
      // can be removed, though
      cost += WORTH_ADDING_BLOCK_TO_REMOVE_THIS_MUCH;
      // if we cannot merge to the end, then we definitely need 2 blocks,
      // and a branch
      // TODO: efficiency, entire body
      if (!canMove(items, getFunction()->body)) {
        cost += 1 + WORTH_ADDING_BLOCK_TO_REMOVE_THIS_MUCH;
        // TODO: to do this, we need to maintain a map of element=>parent,
        //       so that we can insert the new blocks in the right place
        //       for now, just don't do this optimization
        return false;
      }
      // is it worth it?
      return saved > cost;
    };
    // let's see if we can merge deeper than num, to num + 1
    auto next = tails;
    // remove tails that are too short, or that we hit an item we can't handle
    next.erase(std::remove_if(next.begin(),
                              next.end(),
                              [&](Tail& tail) {
                                if (effectiveSize(tail) < num + 1) {
                                  return true;
                                }
                                auto* newItem = getItem(tail, num);
                                // ignore tails that break to outside blocks. we
                                // want to move code to the very outermost
                                // position, so such code cannot be moved
                                // TODO: this should not be a problem in
                                //       *non*-terminating tails, but
                                //       double-verify that
                                if (EffectAnalyzer(
                                      getPassOptions(), *getModule(), newItem)
                                      .hasExternalBreakTargets()) {
                                  return true;
                                }
                                return false;
                              }),
               next.end());
    // if we have enough to investigate, do so
    if (next.size() >= 2) {
      // now we want to find a mergeable item - any item that is equal among a
      // subset
      std::map<Expression*, size_t> hashes; // expression => hash value
      // hash value => expressions with that hash
      std::map<size_t, std::vector<Expression*>> hashed;
      for (auto& tail : next) {
        auto* item = getItem(tail, num);
        auto hash = hashes[item] = ExpressionAnalyzer::hash(item);
        hashed[hash].push_back(item);
      }
      // look at each hash value exactly once. we do this in a deterministic
      // order by iterating over a vector retaining insertion order.
      std::set<size_t> seen;
      for (auto& tail : next) {
        auto* item = getItem(tail, num);
        auto digest = hashes[item];
        if (!seen.emplace(digest).second) {
          continue;
        }

        auto& items = hashed[digest];
        if (items.size() == 1) {
          continue;
        }
        assert(items.size() > 0);
        // look for an item that has another match.
        while (items.size() >= 2) {
          auto first = items[0];
          std::vector<Expression*> others;
          items.erase(
            std::remove_if(items.begin(),
                           items.end(),
                           [&](Expression* item) {
                             if (item ==
                                   first || // don't bother comparing the first
                                 ExpressionAnalyzer::equal(item, first)) {
                               // equal, keep it
                               return false;
                             } else {
                               // unequal, look at it later
                               others.push_back(item);
                               return true;
                             }
                           }),
            items.end());
          if (items.size() >= 2) {
            // possible merge here, investigate it
            auto* correct = items[0];
            auto explore = next;
            explore.erase(std::remove_if(explore.begin(),
                                         explore.end(),
                                         [&](Tail& tail) {
                                           auto* item = getItem(tail, num);
                                           return !ExpressionAnalyzer::equal(
                                             item, correct);
                                         }),
                          explore.end());
            // try to optimize this deeper tail. if we succeed, then stop here,
            // as the changes may influence us. we leave further opts to further
            // passes (as this is rare in practice, it's generally not a perf
            // issue, but TODO optimize)
            if (optimizeTerminatingTails(explore, num + 1)) {
              return true;
            }
          }
          items.swap(others);
        }
      }
    }
    // we explored deeper (higher num) options, but perhaps there
    // was nothing there while there is something we can do at this level
    // but if we are at num == 0, then we found nothing at all
    if (num == 0) {
      return false;
    }
    // if not worth it, stop
    if (!worthIt(num, tails)) {
      return false;
    }
    // this is worth doing, do it!
    auto mergeable = getTailItems(num, tails); // the elements we can merge
    // since we managed a merge, then it might open up more opportunities later
    anotherPass = true;
    Builder builder(*getModule());
    // TODO: don't create one per merge, linear in function size
    LabelUtils::LabelManager labels(getFunction());
    Name innerName = labels.getUnique("folding-inner");
    for (auto& tail : tails) {
      // remove the items we are merging / moving, and add a break
      // also mark as modified, so we don't try to handle them
      // again in this pass, which might be buggy
      if (tail.block) {
        markAsModified(tail.block);
        for (Index i = 0; i < mergeable.size(); i++) {
          tail.block->list.pop_back();
        }
        tail.block->list.push_back(builder.makeBreak(innerName));
        tail.block->finalize(tail.block->type);
      } else {
        markAsModified(tail.expr);
        *tail.pointer = builder.makeBreak(innerName);
      }
    }
    // make a block with the old body + the merged code
    auto* old = getFunction()->body;
    auto* inner = builder.makeBlock();
    inner->name = innerName;
    if (old->type == Type::unreachable) {
      // the old body is not flowed out of anyhow, so just put it there
      inner->list.push_back(old);
    } else {
      // otherwise, we must not flow out to the merged code
      if (old->type == Type::none) {
        inner->list.push_back(old);
        inner->list.push_back(builder.makeReturn());
      } else {
        // looks like we must return this. but if it's a toplevel block
        // then it might be marked as having a type, but not actually
        // returning it (we marked it as such for wasm type-checking
        // rules, and now it won't be toplevel in the function, it can
        // change)
        auto* toplevel = old->dynCast<Block>();
        if (toplevel) {
          toplevel->finalize();
        }
        if (old->type != Type::unreachable) {
          inner->list.push_back(builder.makeReturn(old));
        } else {
          inner->list.push_back(old);
        }
      }
    }
    inner->finalize();
    auto* outer = builder.makeBlock();
    outer->list.push_back(inner);
    while (!mergeable.empty()) {
      outer->list.push_back(mergeable.back());
      mergeable.pop_back();
    }
    // ensure the replacement has the same type, so the outside is not surprised
    outer->finalize(getFunction()->getResults());
    getFunction()->body = outer;
    return true;
  }